

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

uint ON_SubDMeshFragmentGrid::SetQuads
               (uint side_segment_count,uint level_of_detail,uint *quads,size_t quad_capacity,
               size_t quad_stride,uint *sides,size_t side_capacity,size_t side_stride)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  uint *sides1_3;
  uint *sides1_2;
  uint *sides1_1;
  uint *sides1;
  uint vi;
  uint *fvi1;
  uint local_58;
  uint vi1;
  uint vi0;
  uint n;
  uint *fvi;
  uint side_quad_count;
  uint P_dj;
  uint P_di;
  uint side_point_count;
  uint *sides_local;
  size_t quad_stride_local;
  size_t quad_capacity_local;
  uint *quads_local;
  uint level_of_detail_local;
  uint side_segment_count_local;
  
  bVar1 = ON_SubDMeshFragment::SideSegmentCountIsValid(side_segment_count);
  if (!bVar1) {
    ON_SubDIncrementErrorCount();
    return 0;
  }
  if (side_segment_count < 2) {
    quads_local._4_1_ = 0;
  }
  else {
    quads_local._4_4_ = level_of_detail;
    if ((level_of_detail != 0) &&
       ((0x1f < level_of_detail ||
        (side_segment_count < (uint)(1 << ((byte)level_of_detail & 0x1f)))))) {
      for (quads_local._4_4_ = 1; quads_local._4_4_ << 1 < side_segment_count;
          quads_local._4_4_ = quads_local._4_4_ << 1) {
      }
    }
  }
  uVar2 = 1 << (quads_local._4_1_ & 0x1f);
  iVar3 = uVar2 * (side_segment_count + 1);
  uVar4 = side_segment_count / uVar2;
  if ((quad_capacity != 0) || (quads != (uint *)0x0)) {
    if (quad_stride < 4) {
      ON_SubDIncrementErrorCount();
      return 0;
    }
    if (quad_capacity < uVar4 * uVar4) {
      ON_SubDIncrementErrorCount();
      return 0;
    }
    _vi0 = quads;
    for (vi1 = 0; vi1 < uVar4; vi1 = vi1 + 1) {
      local_58 = vi1 * iVar3;
      fvi1._4_4_ = local_58 + iVar3;
      puVar5 = _vi0 + quad_stride * uVar4;
      for (; _vi0 < puVar5; _vi0 = _vi0 + quad_stride) {
        *_vi0 = local_58;
        _vi0[3] = fvi1._4_4_;
        local_58 = uVar2 + local_58;
        fvi1._4_4_ = uVar2 + fvi1._4_4_;
        _vi0[1] = local_58;
        _vi0[2] = fvi1._4_4_;
      }
    }
  }
  if ((side_capacity != 0) || (sides != (uint *)0x0)) {
    if (side_stride == 0) {
      ON_SubDIncrementErrorCount();
      return 0;
    }
    if (side_capacity < uVar4 * 4 + 1) {
      ON_SubDIncrementErrorCount();
      return 0;
    }
    sides1._4_4_ = 0;
    for (_P_di = sides; _P_di < sides + uVar4; _P_di = _P_di + side_stride) {
      *_P_di = sides1._4_4_;
      sides1._4_4_ = uVar2 + sides1._4_4_;
    }
    puVar5 = _P_di + uVar4;
    for (; _P_di < puVar5; _P_di = _P_di + side_stride) {
      *_P_di = sides1._4_4_;
      sides1._4_4_ = iVar3 + sides1._4_4_;
    }
    puVar5 = _P_di + uVar4;
    for (; _P_di < puVar5; _P_di = _P_di + side_stride) {
      *_P_di = sides1._4_4_;
      sides1._4_4_ = sides1._4_4_ - uVar2;
    }
    puVar5 = _P_di + uVar4;
    for (; _P_di < puVar5; _P_di = _P_di + side_stride) {
      *_P_di = sides1._4_4_;
      sides1._4_4_ = sides1._4_4_ - iVar3;
    }
    *_P_di = 0;
  }
  return uVar4 * uVar4;
}

Assistant:

unsigned int ON_SubDMeshFragmentGrid::SetQuads(
  unsigned int side_segment_count,
  unsigned int level_of_detail,
  unsigned int* quads,
  size_t quad_capacity,
  size_t quad_stride,
  unsigned int* sides,
  size_t side_capacity,
  size_t side_stride
)
{
  if ( false == ON_SubDMeshFragment::SideSegmentCountIsValid(side_segment_count) )
    return ON_SUBD_RETURN_ERROR(0);

  if ( side_segment_count <= 1 )
    level_of_detail = 0;
  else if (level_of_detail > 0)
  {
    if (level_of_detail >= 32 || 1U << level_of_detail > side_segment_count)
    {
      level_of_detail = 1;
      while ( 2*level_of_detail < side_segment_count )
        level_of_detail*= 2;
    }
  }


  const unsigned int side_point_count = (side_segment_count+1);
  const unsigned int P_di = (1 << level_of_detail);
  const unsigned int P_dj = P_di*side_point_count;

  const unsigned int side_quad_count = side_segment_count / P_di;

  if (quad_capacity > 0 || nullptr != quads)
  {
    if ( quad_stride < 4 )
      return ON_SUBD_RETURN_ERROR(0);
    if (side_quad_count*side_quad_count > quad_capacity)
      return ON_SUBD_RETURN_ERROR(0);

    unsigned int* fvi = quads;
    for (unsigned int n = 0; n < side_quad_count; n++)
    {
      unsigned int vi0 = n*P_dj;
      unsigned int vi1 = vi0 + P_dj;
      for (const unsigned int* fvi1 = fvi + quad_stride*side_quad_count; fvi < fvi1; fvi += quad_stride)
      {
        fvi[0] = vi0;
        fvi[3] = vi1;
        vi0 += P_di;
        vi1 += P_di;
        fvi[1] = vi0;
        fvi[2] = vi1;
      }
    }
  }

  if (side_capacity > 0 || nullptr != sides)
  {
    if ( side_stride < 1 )
      return ON_SUBD_RETURN_ERROR(0);
    if (side_capacity < 4*side_quad_count +1 )
      return ON_SUBD_RETURN_ERROR(0);

    unsigned int vi = 0;

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi += P_di;
    }

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi += P_dj;
    }

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi -= P_di;
    }

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi -= P_dj;
    }

    *sides = 0;
  }

  return side_quad_count*side_quad_count;
}